

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unitcell_xml.cpp
# Opt level: O0

void __thiscall UnitcellXMLTest_ReadXML3_Test::TestBody(UnitcellXMLTest_ReadXML3_Test *this)

{
  bool bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  self_type *psVar4;
  bond_t *message;
  bond_t *pbVar5;
  CommaInitializer<Eigen::Matrix<long,__1,_1,_0,__1,_1>_> *this_00;
  AssertionResult gtest_ar_8;
  offset_t offset;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_;
  unitcell cell;
  ptree *root;
  ptree pt;
  istringstream is;
  bool *in_stack_fffffffffffffa68;
  undefined7 in_stack_fffffffffffffa70;
  undefined1 in_stack_fffffffffffffa77;
  DenseBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>_> *in_stack_fffffffffffffa78;
  CommaInitializer<Eigen::Matrix<long,__1,_1,_0,__1,_1>_> *in_stack_fffffffffffffa80;
  char *in_stack_fffffffffffffa88;
  undefined7 in_stack_fffffffffffffa90;
  undefined1 in_stack_fffffffffffffa97;
  undefined8 in_stack_fffffffffffffa98;
  Type TVar6;
  AssertHelper *in_stack_fffffffffffffaa0;
  char (*in_stack_fffffffffffffab0) [1];
  int iVar7;
  path_type *in_stack_fffffffffffffab8;
  undefined7 in_stack_fffffffffffffac0;
  undefined1 in_stack_fffffffffffffac7;
  char *in_stack_fffffffffffffad0;
  undefined7 in_stack_fffffffffffffad8;
  undefined1 in_stack_fffffffffffffadf;
  char *in_stack_fffffffffffffae0;
  AssertionResult *in_stack_fffffffffffffae8;
  Message *in_stack_fffffffffffffaf8;
  AssertHelper *in_stack_fffffffffffffb00;
  unitcell *cell_00;
  string *in_stack_fffffffffffffb68;
  ptree *in_stack_fffffffffffffb70;
  AssertionResult local_488;
  undefined8 local_478;
  undefined8 local_470;
  undefined8 local_468;
  undefined4 local_43c;
  undefined4 local_414;
  AssertionResult local_410 [2];
  undefined4 local_3ec;
  AssertionResult local_3e8 [2];
  undefined4 local_3c4;
  AssertionResult local_3c0 [2];
  undefined4 local_39c;
  AssertionResult local_398 [2];
  undefined4 local_374;
  AssertionResult local_370 [2];
  size_t local_350;
  undefined4 local_344;
  AssertionResult local_340 [2];
  size_t local_320;
  undefined4 local_314;
  AssertionResult local_310 [2];
  size_t local_2f0;
  undefined4 local_2e4;
  AssertionResult local_2e0;
  string local_2d0 [55];
  allocator local_299;
  string local_298 [39];
  undefined1 local_271;
  AssertionResult local_270;
  unitcell local_260;
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_220;
  self_type *local_1f0;
  undefined1 local_1a9 [33];
  istringstream local_188 [392];
  
  TVar6 = (Type)((ulong)in_stack_fffffffffffffa98 >> 0x20);
  cell_00 = (unitcell *)local_1a9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)(local_1a9 + 1),
             "\n<UNITCELL name=\"anisotropic3d\" dimension=\"3\">\n  <VERTEX/>\n  <EDGE type=\"0\"><SOURCE vertex=\"1\"/><TARGET vertex=\"1\" offset=\"1 0 0\"/></EDGE>\n  <EDGE type=\"1\"><SOURCE vertex=\"1\"/><TARGET vertex=\"1\" offset=\"0 1 0\"/></EDGE>\n  <EDGE type=\"2\"><SOURCE vertex=\"1\"/><TARGET vertex=\"1\" offset=\"0 0 1\"/></EDGE>\n</UNITCELL>\n    "
             ,(allocator *)cell_00);
  std::__cxx11::istringstream::istringstream(local_188,local_1a9 + 1,8);
  std::__cxx11::string::~string((string *)(local_1a9 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_1a9);
  boost::property_tree::
  basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::basic_ptree((basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)CONCAT17(in_stack_fffffffffffffa97,in_stack_fffffffffffffa90));
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::string_path(&local_220,"LATTICES",0x2e);
  psVar4 = boost::property_tree::
           basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::put<char[1]>((basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)CONCAT17(in_stack_fffffffffffffac7,in_stack_fffffffffffffac0),
                          in_stack_fffffffffffffab8,in_stack_fffffffffffffab0);
  iVar7 = (int)((ulong)in_stack_fffffffffffffab0 >> 0x20);
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~string_path((string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)0x10f935);
  local_1f0 = psVar4;
  boost::property_tree::xml_parser::
  read_xml<boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>>
            ((basic_istream<char,_std::char_traits<char>_> *)
             CONCAT17(in_stack_fffffffffffffac7,in_stack_fffffffffffffac0),
             (basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_fffffffffffffab8,iVar7);
  lattice::unitcell::unitcell
            ((unitcell *)CONCAT17(in_stack_fffffffffffffa77,in_stack_fffffffffffffa70));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_298,"anisotropic3d",&local_299);
  local_271 = lattice::read_xml(in_stack_fffffffffffffb70,in_stack_fffffffffffffb68,cell_00);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT17(in_stack_fffffffffffffa77,in_stack_fffffffffffffa70),
             in_stack_fffffffffffffa68,(type *)0x10f9ef);
  std::__cxx11::string::~string(local_298);
  std::allocator<char>::~allocator((allocator<char> *)&local_299);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_270);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffaa0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffffae8,in_stack_fffffffffffffae0,
               (char *)CONCAT17(in_stack_fffffffffffffadf,in_stack_fffffffffffffad8),
               in_stack_fffffffffffffad0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffaa0,TVar6,
               (char *)CONCAT17(in_stack_fffffffffffffa97,in_stack_fffffffffffffa90),
               (int)((ulong)in_stack_fffffffffffffa88 >> 0x20),(char *)in_stack_fffffffffffffa80);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffa77,in_stack_fffffffffffffa70));
    std::__cxx11::string::~string(local_2d0);
    testing::Message::~Message((Message *)0x10fbe2);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10fc5d);
  local_2e4 = 3;
  local_2f0 = lattice::unitcell::dimension(&local_260);
  testing::internal::EqHelper::Compare<int,_unsigned_long,_nullptr>
            (in_stack_fffffffffffffa88,(char *)in_stack_fffffffffffffa80,
             (int *)in_stack_fffffffffffffa78,
             (unsigned_long *)CONCAT17(in_stack_fffffffffffffa77,in_stack_fffffffffffffa70));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_2e0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffaa0);
    testing::AssertionResult::failure_message((AssertionResult *)0x10fd44);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffaa0,TVar6,
               (char *)CONCAT17(in_stack_fffffffffffffa97,in_stack_fffffffffffffa90),
               (int)((ulong)in_stack_fffffffffffffa88 >> 0x20),(char *)in_stack_fffffffffffffa80);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffa77,in_stack_fffffffffffffa70));
    testing::Message::~Message((Message *)0x10fda7);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10fdff);
  local_314 = 1;
  local_320 = lattice::unitcell::num_sites((unitcell *)0x10fe17);
  testing::internal::EqHelper::Compare<int,_unsigned_long,_nullptr>
            (in_stack_fffffffffffffa88,(char *)in_stack_fffffffffffffa80,
             (int *)in_stack_fffffffffffffa78,
             (unsigned_long *)CONCAT17(in_stack_fffffffffffffa77,in_stack_fffffffffffffa70));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_310);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffaa0);
    testing::AssertionResult::failure_message((AssertionResult *)0x10fecd);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffaa0,TVar6,
               (char *)CONCAT17(in_stack_fffffffffffffa97,in_stack_fffffffffffffa90),
               (int)((ulong)in_stack_fffffffffffffa88 >> 0x20),(char *)in_stack_fffffffffffffa80);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffa77,in_stack_fffffffffffffa70));
    testing::Message::~Message((Message *)0x10ff30);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10ff88);
  local_344 = 3;
  local_350 = lattice::unitcell::num_bonds((unitcell *)0x10ffa0);
  testing::internal::EqHelper::Compare<int,_unsigned_long,_nullptr>
            (in_stack_fffffffffffffa88,(char *)in_stack_fffffffffffffa80,
             (int *)in_stack_fffffffffffffa78,
             (unsigned_long *)CONCAT17(in_stack_fffffffffffffa77,in_stack_fffffffffffffa70));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_340);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffaa0);
    in_stack_fffffffffffffb00 =
         (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x110056);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffaa0,TVar6,
               (char *)CONCAT17(in_stack_fffffffffffffa97,in_stack_fffffffffffffa90),
               (int)((ulong)in_stack_fffffffffffffa88 >> 0x20),(char *)in_stack_fffffffffffffa80);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffa77,in_stack_fffffffffffffa70));
    testing::Message::~Message((Message *)0x1100b9);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x110111);
  local_374 = 0;
  message = lattice::unitcell::bond
                      ((unitcell *)CONCAT17(in_stack_fffffffffffffa77,in_stack_fffffffffffffa70),
                       (size_t)in_stack_fffffffffffffa68);
  testing::internal::EqHelper::Compare<int,_unsigned_long,_nullptr>
            (in_stack_fffffffffffffa88,(char *)in_stack_fffffffffffffa80,
             (int *)in_stack_fffffffffffffa78,
             (unsigned_long *)CONCAT17(in_stack_fffffffffffffa77,in_stack_fffffffffffffa70));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_370);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffaa0);
    testing::AssertionResult::failure_message((AssertionResult *)0x1101d3);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffaa0,TVar6,
               (char *)CONCAT17(in_stack_fffffffffffffa97,in_stack_fffffffffffffa90),
               (int)((ulong)in_stack_fffffffffffffa88 >> 0x20),(char *)in_stack_fffffffffffffa80);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffb00,(Message *)message);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffa77,in_stack_fffffffffffffa70));
    testing::Message::~Message((Message *)0x110236);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x11028e);
  local_39c = 0;
  lattice::unitcell::bond
            ((unitcell *)CONCAT17(in_stack_fffffffffffffa77,in_stack_fffffffffffffa70),
             (size_t)in_stack_fffffffffffffa68);
  testing::internal::EqHelper::Compare<int,_unsigned_long,_nullptr>
            (in_stack_fffffffffffffa88,(char *)in_stack_fffffffffffffa80,
             (int *)in_stack_fffffffffffffa78,
             (unsigned_long *)CONCAT17(in_stack_fffffffffffffa77,in_stack_fffffffffffffa70));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_398);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffaa0);
    testing::AssertionResult::failure_message((AssertionResult *)0x110348);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffaa0,TVar6,
               (char *)CONCAT17(in_stack_fffffffffffffa97,in_stack_fffffffffffffa90),
               (int)((ulong)in_stack_fffffffffffffa88 >> 0x20),(char *)in_stack_fffffffffffffa80);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffb00,(Message *)message);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffa77,in_stack_fffffffffffffa70));
    testing::Message::~Message((Message *)0x1103a5);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1103fa);
  local_3c4 = 0;
  lattice::unitcell::bond
            ((unitcell *)CONCAT17(in_stack_fffffffffffffa77,in_stack_fffffffffffffa70),
             (size_t)in_stack_fffffffffffffa68);
  testing::internal::EqHelper::Compare<int,_unsigned_long,_nullptr>
            (in_stack_fffffffffffffa88,(char *)in_stack_fffffffffffffa80,
             (int *)in_stack_fffffffffffffa78,
             (unsigned_long *)CONCAT17(in_stack_fffffffffffffa77,in_stack_fffffffffffffa70));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_3c0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffaa0);
    testing::AssertionResult::failure_message((AssertionResult *)0x1104b1);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffaa0,TVar6,
               (char *)CONCAT17(in_stack_fffffffffffffa97,in_stack_fffffffffffffa90),
               (int)((ulong)in_stack_fffffffffffffa88 >> 0x20),(char *)in_stack_fffffffffffffa80);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffb00,(Message *)message);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffa77,in_stack_fffffffffffffa70));
    testing::Message::~Message((Message *)0x11050e);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x110566);
  local_3ec = 0;
  lattice::unitcell::bond
            ((unitcell *)CONCAT17(in_stack_fffffffffffffa77,in_stack_fffffffffffffa70),
             (size_t)in_stack_fffffffffffffa68);
  testing::internal::EqHelper::Compare<int,_unsigned_long,_nullptr>
            (in_stack_fffffffffffffa88,(char *)in_stack_fffffffffffffa80,
             (int *)in_stack_fffffffffffffa78,
             (unsigned_long *)CONCAT17(in_stack_fffffffffffffa77,in_stack_fffffffffffffa70));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_3e8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffaa0);
    in_stack_fffffffffffffaa0 =
         (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x110621);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffaa0,TVar6,
               (char *)CONCAT17(in_stack_fffffffffffffa97,in_stack_fffffffffffffa90),
               (int)((ulong)in_stack_fffffffffffffa88 >> 0x20),(char *)in_stack_fffffffffffffa80);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffb00,(Message *)message);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffa77,in_stack_fffffffffffffa70));
    testing::Message::~Message((Message *)0x11067e);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1106d6);
  local_414 = 2;
  pbVar5 = lattice::unitcell::bond
                     ((unitcell *)CONCAT17(in_stack_fffffffffffffa77,in_stack_fffffffffffffa70),
                      (size_t)in_stack_fffffffffffffa68);
  TVar6 = (Type)((ulong)pbVar5 >> 0x20);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            (in_stack_fffffffffffffa88,(char *)in_stack_fffffffffffffa80,
             (int *)in_stack_fffffffffffffa78,
             (int *)CONCAT17(in_stack_fffffffffffffa77,in_stack_fffffffffffffa70));
  uVar2 = testing::AssertionResult::operator_cast_to_bool(local_410);
  if (!(bool)uVar2) {
    testing::Message::Message((Message *)in_stack_fffffffffffffaa0);
    in_stack_fffffffffffffa88 =
         testing::AssertionResult::failure_message((AssertionResult *)0x110791);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffaa0,TVar6,(char *)CONCAT17(uVar2,in_stack_fffffffffffffa90),
               (int)((ulong)in_stack_fffffffffffffa88 >> 0x20),(char *)in_stack_fffffffffffffa80);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffb00,(Message *)message);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffa77,in_stack_fffffffffffffa70));
    testing::Message::~Message((Message *)0x1107ee);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x110846);
  local_43c = 3;
  Eigen::Matrix<long,_-1,_1,_0,_-1,_1>::Matrix<int>
            ((Matrix<long,__1,_1,_0,__1,_1> *)in_stack_fffffffffffffa80,
             (int *)in_stack_fffffffffffffa78);
  local_468 = 0;
  Eigen::DenseBase<Eigen::Matrix<long,_-1,_1,_0,_-1,_1>_>::operator<<
            (in_stack_fffffffffffffa78,
             (Scalar *)CONCAT17(in_stack_fffffffffffffa77,in_stack_fffffffffffffa70));
  local_470 = 1;
  this_00 = Eigen::CommaInitializer<Eigen::Matrix<long,_-1,_1,_0,_-1,_1>_>::operator_
                      (in_stack_fffffffffffffa80,(Scalar *)in_stack_fffffffffffffa78);
  local_478 = 0;
  Eigen::CommaInitializer<Eigen::Matrix<long,_-1,_1,_0,_-1,_1>_>::operator_
            (this_00,(Scalar *)in_stack_fffffffffffffa78);
  Eigen::CommaInitializer<Eigen::Matrix<long,_-1,_1,_0,_-1,_1>_>::~CommaInitializer
            ((CommaInitializer<Eigen::Matrix<long,__1,_1,_0,__1,_1>_> *)0x1108e8);
  pbVar5 = lattice::unitcell::bond
                     ((unitcell *)CONCAT17(in_stack_fffffffffffffa77,in_stack_fffffffffffffa70),
                      (size_t)in_stack_fffffffffffffa68);
  testing::internal::EqHelper::
  Compare<Eigen::Matrix<long,__1,_1,_0,__1,_1>,_Eigen::Matrix<long,__1,_1,_0,__1,_1>,_nullptr>
            (in_stack_fffffffffffffa88,(char *)this_00,(Matrix<long,__1,_1,_0,__1,_1> *)pbVar5,
             (Matrix<long,__1,_1,_0,__1,_1> *)
             CONCAT17(in_stack_fffffffffffffa77,in_stack_fffffffffffffa70));
  iVar7 = (int)((ulong)in_stack_fffffffffffffa88 >> 0x20);
  uVar3 = testing::AssertionResult::operator_cast_to_bool(&local_488);
  if (!(bool)uVar3) {
    testing::Message::Message((Message *)in_stack_fffffffffffffaa0);
    testing::AssertionResult::failure_message((AssertionResult *)0x1109d7);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffaa0,TVar6,(char *)CONCAT17(uVar2,in_stack_fffffffffffffa90),
               iVar7,(char *)this_00);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffb00,(Message *)message);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(uVar3,in_stack_fffffffffffffa70));
    testing::Message::~Message((Message *)0x110a32);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x110a87);
  Eigen::Matrix<long,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<long,__1,_1,_0,__1,_1> *)0x110a94);
  lattice::unitcell::~unitcell((unitcell *)CONCAT17(uVar3,in_stack_fffffffffffffa70));
  boost::property_tree::
  basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~basic_ptree((basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)CONCAT17(uVar3,in_stack_fffffffffffffa70));
  std::__cxx11::istringstream::~istringstream(local_188);
  return;
}

Assistant:

TEST(UnitcellXMLTest, ReadXML3) {
  std::istringstream is(R"(
<UNITCELL name="anisotropic3d" dimension="3">
  <VERTEX/>
  <EDGE type="0"><SOURCE vertex="1"/><TARGET vertex="1" offset="1 0 0"/></EDGE>
  <EDGE type="1"><SOURCE vertex="1"/><TARGET vertex="1" offset="0 1 0"/></EDGE>
  <EDGE type="2"><SOURCE vertex="1"/><TARGET vertex="1" offset="0 0 1"/></EDGE>
</UNITCELL>
    )");

  ptree pt;
  ptree& root = pt.put("LATTICES", "");
  read_xml(is, root);

  unitcell cell;
  EXPECT_TRUE(read_xml(pt, "anisotropic3d", cell));
  EXPECT_EQ(3, cell.dimension());
  EXPECT_EQ(1, cell.num_sites());
  EXPECT_EQ(3, cell.num_bonds());
  EXPECT_EQ(0, cell.bond(0).source);
  EXPECT_EQ(0, cell.bond(0).target);
  EXPECT_EQ(0, cell.bond(2).source);
  EXPECT_EQ(0, cell.bond(2).target);
  EXPECT_EQ(2, cell.bond(2).type);
  offset_t offset(3);
  offset << 0, 1, 0;
  EXPECT_EQ(offset, cell.bond(1).target_offset);
}